

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::commoditizedUnit(string *unit_string,precise_unit actUnit,size_t *index)

{
  size_t sVar1;
  unit_data uVar2;
  int iVar3;
  uint32_t uVar4;
  long lVar5;
  undefined8 uVar6;
  precise_unit pVar7;
  size_type ccindex;
  string commodStr;
  undefined8 local_90;
  size_t local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  undefined8 local_40;
  undefined8 local_38;
  
  local_90 = actUnit._8_8_;
  lVar5 = std::__cxx11::string::find((char)unit_string,0x7b);
  uVar6 = local_90;
  if (lVar5 != -1) {
    sVar1 = lVar5 + 1;
    local_88 = sVar1;
    segmentcheck(unit_string,'}',&local_88);
    if ((local_88 - sVar1 == 2) && ((unit_string->_M_dataplus)._M_p[sVar1] == '#')) {
      *index = local_88;
      uVar2 = detail::unit_data::operator*((unit_data *)&local_90,(unit_data *)((long)&count + 4));
      uVar6 = CONCAT44(local_90._4_4_,uVar2);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)unit_string);
      iVar3 = std::__cxx11::string::compare((char *)&local_80);
      if (iVar3 == 0) {
        *index = local_88;
        local_40 = 0x3ff0000000000000;
        local_38 = 0x604335a004000000;
        uVar2 = detail::unit_data::operator*((unit_data *)&local_90,(unit_data *)&local_38);
        uVar6 = CONCAT44(local_38._4_4_ | local_90._4_4_,uVar2);
      }
      else {
        if (local_80 == &local_70) {
          local_60.field_2._8_8_ = local_70._8_8_;
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        }
        else {
          local_60._M_dataplus._M_p = (pointer)local_80;
        }
        local_60.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
        local_60.field_2._M_local_buf[0] = local_70._M_local_buf[0];
        local_60._M_string_length = local_78;
        local_78 = 0;
        local_70._M_local_buf[0] = '\0';
        local_80 = &local_70;
        uVar4 = getCommodity(&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        *index = local_88;
        uVar6 = CONCAT44(uVar4 | local_90._4_4_,local_90._0_4_);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT71(local_70._M_allocated_capacity._1_7_,
                                          local_70._M_local_buf[0]) + 1);
      }
    }
  }
  pVar7.base_units_ = (unit_data)(int)uVar6;
  pVar7.commodity_ = (int)((ulong)uVar6 >> 0x20);
  pVar7.multiplier_ = actUnit.multiplier_;
  return pVar7;
}

Assistant:

static precise_unit commoditizedUnit(
    const std::string& unit_string,
    precise_unit actUnit,
    size_t& index)
{
    auto ccindex = unit_string.find_first_of('{');
    if (ccindex == std::string::npos) {
        return actUnit;
    }
    ++ccindex;
    auto start = ccindex;
    segmentcheck(unit_string, '}', ccindex);
    if (ccindex - start == 2) {
        // there are a couple units that might look like commodities
        if (unit_string[start] == '#') {
            index = ccindex;
            return actUnit * count;
        }
    }
    std::string commodStr = unit_string.substr(start, ccindex - start - 1);
    if (commodStr == "cells") {
        index = ccindex;
        return actUnit * precise_unit(1.0, precise::count, commodities::cell);
    }
    auto hcode = getCommodity(std::move(commodStr));
    index = ccindex;
    return {1.0, actUnit, hcode};
}